

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnTableFillExpr(BinaryReaderIR *this,Index table_index)

{
  Result RVar1;
  Expr *pEVar2;
  _Head_base<0UL,_wabt::Expr_*,_false> local_90;
  Location local_88;
  Var local_60;
  
  local_88.field_1.field_0.line = 0;
  local_88.field_1._4_8_ = 0;
  local_88.filename.data_ = (char *)0x0;
  local_88.filename.size_._0_4_ = 0;
  local_88.filename.size_._4_4_ = 0;
  Var::Var(&local_60,table_index,&local_88);
  pEVar2 = (Expr *)operator_new(0x88);
  (pEVar2->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar2->loc).filename.data_ = (char *)0x0;
  (pEVar2->loc).filename.size_ = 0;
  *(undefined8 *)((long)&(pEVar2->loc).filename.size_ + 4) = 0;
  *(undefined8 *)((long)&(pEVar2->loc).field_1.field_1.offset + 4) = 0;
  pEVar2->type_ = TableFill;
  pEVar2->_vptr_Expr = (_func_int **)&PTR__VarExpr_001acdc0;
  Var::Var((Var *)(pEVar2 + 1),&local_60);
  local_90._M_head_impl = pEVar2;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_90);
  if (local_90._M_head_impl != (Expr *)0x0) {
    (*(local_90._M_head_impl)->_vptr_Expr[1])();
  }
  Var::~Var(&local_60);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnTableFillExpr(Index table_index) {
  return AppendExpr(MakeUnique<TableFillExpr>(Var(table_index)));
}